

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag.cpp
# Opt level: O1

void __thiscall despot::Tag::Tag(Tag *this)

{
  ulong *puVar1;
  long *plVar2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  int iVar3;
  undefined8 *puVar4;
  OBS_TYPE OVar5;
  ulong uVar6;
  OBS_TYPE OVar7;
  int rob;
  OBS_TYPE OVar8;
  string map;
  istringstream iss;
  ulong *local_2f8;
  long local_2f0;
  ulong local_2e8;
  undefined4 uStack_2e0;
  undefined4 uStack_2dc;
  ulong *local_2d8;
  long local_2d0;
  ulong local_2c8;
  undefined4 uStack_2c0;
  undefined4 uStack_2bc;
  ulong *local_2b8;
  long local_2b0;
  ulong local_2a8;
  undefined4 uStack_2a0;
  undefined4 uStack_29c;
  ulong *local_298;
  long local_290;
  ulong local_288 [2];
  ulong *local_278;
  long local_270;
  ulong local_268 [2];
  ulong *local_258;
  long local_250;
  ulong local_248 [2];
  long *local_238;
  undefined8 local_230;
  long local_228;
  undefined8 uStack_220;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_218;
  ulong *local_210;
  long local_208;
  ulong local_200 [2];
  ulong *local_1f0;
  long local_1e8;
  ulong local_1e0 [2];
  ulong *local_1d0;
  long local_1c8;
  ulong local_1c0 [2];
  ulong *local_1b0;
  long local_1a8;
  ulong local_1a0;
  undefined4 uStack_198;
  undefined4 uStack_194;
  ios_base local_138 [264];
  
  BaseTag::BaseTag(&this->super_BaseTag);
  *(undefined ***)&this->super_BaseTag = &PTR__Tag_0011fa00;
  *(undefined ***)&(this->super_BaseTag).super_BeliefMDP = &PTR__Tag_0011fb30;
  *(undefined ***)&(this->super_BaseTag).super_StateIndexer = &PTR__Tag_0011fc38;
  *(undefined ***)&(this->super_BaseTag).super_StatePolicy = &PTR__Tag_0011fc70;
  *(undefined ***)&(this->super_BaseTag).super_MMAPInferencer = &PTR__Tag_0011fc98;
  local_218 = &this->obs_;
  (this->obs_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->obs_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->obs_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_210 = local_200;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"mapSize = 5 10\n","");
  local_258 = local_248;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"#####...##\n","");
  uVar6 = 0xf;
  if (local_210 != local_200) {
    uVar6 = local_200[0];
  }
  if (uVar6 < (ulong)(local_250 + local_208)) {
    uVar6 = 0xf;
    if (local_258 != local_248) {
      uVar6 = local_248[0];
    }
    if (uVar6 < (ulong)(local_250 + local_208)) goto LAB_00116771;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_258,0,(char *)0x0,(ulong)local_210);
  }
  else {
LAB_00116771:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_210,(ulong)local_258);
  }
  local_2f8 = &local_2e8;
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_2e8 = *puVar1;
    uStack_2e0 = *(undefined4 *)(puVar4 + 3);
    uStack_2dc = *(undefined4 *)((long)puVar4 + 0x1c);
  }
  else {
    local_2e8 = *puVar1;
    local_2f8 = (ulong *)*puVar4;
  }
  local_2f0 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_278 = local_268;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"#####...##\n","");
  uVar6 = 0xf;
  if (local_2f8 != &local_2e8) {
    uVar6 = local_2e8;
  }
  if (uVar6 < (ulong)(local_270 + local_2f0)) {
    uVar6 = 0xf;
    if (local_278 != local_268) {
      uVar6 = local_268[0];
    }
    if (uVar6 < (ulong)(local_270 + local_2f0)) goto LAB_0011684f;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_278,0,(char *)0x0,(ulong)local_2f8);
  }
  else {
LAB_0011684f:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2f8,(ulong)local_278);
  }
  local_2d8 = &local_2c8;
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_2c8 = *puVar1;
    uStack_2c0 = *(undefined4 *)(puVar4 + 3);
    uStack_2bc = *(undefined4 *)((long)puVar4 + 0x1c);
  }
  else {
    local_2c8 = *puVar1;
    local_2d8 = (ulong *)*puVar4;
  }
  local_2d0 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_298 = local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"#####...##\n","");
  uVar6 = 0xf;
  if (local_2d8 != &local_2c8) {
    uVar6 = local_2c8;
  }
  if (uVar6 < (ulong)(local_290 + local_2d0)) {
    uVar6 = 0xf;
    if (local_298 != local_288) {
      uVar6 = local_288[0];
    }
    if (uVar6 < (ulong)(local_290 + local_2d0)) goto LAB_0011691a;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_298,0,(char *)0x0,(ulong)local_2d8);
  }
  else {
LAB_0011691a:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2d8,(ulong)local_298);
  }
  local_2b8 = &local_2a8;
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_2a8 = *puVar1;
    uStack_2a0 = *(undefined4 *)(puVar4 + 3);
    uStack_29c = *(undefined4 *)((long)puVar4 + 0x1c);
  }
  else {
    local_2a8 = *puVar1;
    local_2b8 = (ulong *)*puVar4;
  }
  local_2b0 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_1d0 = local_1c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"...........\n","");
  uVar6 = 0xf;
  if (local_2b8 != &local_2a8) {
    uVar6 = local_2a8;
  }
  if (uVar6 < (ulong)(local_1c8 + local_2b0)) {
    uVar6 = 0xf;
    if (local_1d0 != local_1c0) {
      uVar6 = local_1c0[0];
    }
    if (uVar6 < (ulong)(local_1c8 + local_2b0)) goto LAB_001169f2;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1d0,0,(char *)0x0,(ulong)local_2b8);
  }
  else {
LAB_001169f2:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2b8,(ulong)local_1d0);
  }
  local_1b0 = &local_1a0;
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_1a0 = *puVar1;
    uStack_198 = *(undefined4 *)(puVar4 + 3);
    uStack_194 = *(undefined4 *)((long)puVar4 + 0x1c);
  }
  else {
    local_1a0 = *puVar1;
    local_1b0 = (ulong *)*puVar4;
  }
  local_1a8 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_1f0 = local_1e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"...........","");
  uVar6 = 0xf;
  if (local_1b0 != &local_1a0) {
    uVar6 = local_1a0;
  }
  if (uVar6 < (ulong)(local_1e8 + local_1a8)) {
    uVar6 = 0xf;
    if (local_1f0 != local_1e0) {
      uVar6 = local_1e0[0];
    }
    if ((ulong)(local_1e8 + local_1a8) <= uVar6) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1f0,0,(char *)0x0,(ulong)local_1b0);
      goto LAB_00116b08;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1b0,(ulong)local_1f0);
LAB_00116b08:
  local_238 = &local_228;
  plVar2 = puVar4 + 2;
  if ((long *)*puVar4 == plVar2) {
    local_228 = *plVar2;
    uStack_220 = puVar4[3];
  }
  else {
    local_228 = *plVar2;
    local_238 = (long *)*puVar4;
  }
  local_230 = puVar4[1];
  *puVar4 = plVar2;
  puVar4[1] = 0;
  *(undefined1 *)plVar2 = 0;
  if (local_1f0 != local_1e0) {
    operator_delete(local_1f0,local_1e0[0] + 1);
  }
  if (local_1b0 != &local_1a0) {
    operator_delete(local_1b0,local_1a0 + 1);
  }
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0,local_1c0[0] + 1);
  }
  if (local_2b8 != &local_2a8) {
    operator_delete(local_2b8,local_2a8 + 1);
  }
  if (local_298 != local_288) {
    operator_delete(local_298,local_288[0] + 1);
  }
  if (local_2d8 != &local_2c8) {
    operator_delete(local_2d8,local_2c8 + 1);
  }
  this_00 = local_218;
  if (local_278 != local_268) {
    operator_delete(local_278,local_268[0] + 1);
  }
  if (local_2f8 != &local_2e8) {
    operator_delete(local_2f8,local_2e8 + 1);
  }
  if (local_258 != local_248) {
    operator_delete(local_258,local_248[0] + 1);
  }
  if (local_210 != local_200) {
    operator_delete(local_210,local_200[0] + 1);
  }
  std::__cxx11::istringstream::istringstream((istringstream *)&local_1b0,(string *)&local_238,_S_in)
  ;
  BaseTag::Init(&this->super_BaseTag,(istream *)&local_1b0);
  iVar3 = despot::Floor::NumCells();
  (this->super_BaseTag).same_loc_obs_ = (long)iVar3;
  iVar3 = (**(code **)(*(long *)&this->super_BaseTag + 0x10))(this);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(this_00,(long)iVar3);
  OVar8 = 0;
  while( true ) {
    iVar3 = despot::Floor::NumCells();
    if ((long)iVar3 <= (long)OVar8) break;
    OVar7 = 0;
    while( true ) {
      iVar3 = despot::Floor::NumCells();
      if (iVar3 <= (int)OVar7) break;
      iVar3 = despot::Floor::NumCells();
      OVar5 = OVar8;
      if (OVar8 == OVar7) {
        OVar5 = (this->super_BaseTag).same_loc_obs_;
      }
      (this->obs_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[iVar3 * (int)OVar8 + (int)OVar7] = OVar5;
      OVar7 = OVar7 + 1;
    }
    OVar8 = OVar8 + 1;
  }
  (this->super_BaseTag).robot_pos_unknown_ = false;
  std::__cxx11::istringstream::~istringstream((istringstream *)&local_1b0);
  std::ios_base::~ios_base(local_138);
  if (local_238 != &local_228) {
    operator_delete(local_238,local_228 + 1);
  }
  return;
}

Assistant:

Tag::Tag() {
	string map = string("mapSize = 5 10\n") + string("#####...##\n")
		+ string("#####...##\n") + string("#####...##\n")
		+ string("...........\n") + string("...........");
	istringstream iss(map);
	Init(iss);

	same_loc_obs_ = floor_.NumCells();
	obs_.resize(NumStates());
	for (int rob = 0; rob < floor_.NumCells(); rob++) {
		for (int opp = 0; opp < floor_.NumCells(); opp++) {
			int s = RobOppIndicesToStateIndex(rob, opp);
			obs_[s] = (rob == opp ? same_loc_obs_ : rob);
		}
	}
  robot_pos_unknown_ = false;
}